

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O0

void sv_send_cb(uv_udp_send_t *req,int status)

{
  bool bVar1;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  int status_local;
  uv_udp_send_t *req_local;
  
  if (req == (uv_udp_send_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0x69,"req","!=","NULL",0,"!=",0);
    abort();
  }
  if ((long)status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0x6a,"status","==","0",(long)status,"==",0);
    abort();
  }
  bVar1 = true;
  if (req->handle != &server) {
    bVar1 = req->handle == &client;
  }
  if (!bVar1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-send-and-recv.c"
            ,0x6b,"(uv_udp_t*)(req->handle) == &server || (uv_udp_t*)(req->handle) == &client","!=",
            "0",0,"!=",0);
    abort();
  }
  uv_close(req->handle,close_cb);
  free(req);
  sv_send_cb_called = sv_send_cb_called + 1;
  return;
}

Assistant:

static void sv_send_cb(uv_udp_send_t* req, int status) {
  ASSERT_NOT_NULL(req);
  ASSERT_OK(status);
  CHECK_HANDLE(req->handle);

  uv_close((uv_handle_t*) req->handle, close_cb);
  free(req);

  sv_send_cb_called++;
}